

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::output_example_seq(vw *all,cb_explore_adf *data,multi_ex *ec_seq)

{
  undefined4 uVar1;
  code *pcVar2;
  size_type sVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  multi_ex *in_stack_00000280;
  cb_explore_adf *in_stack_00000288;
  vw *in_stack_00000290;
  allocator local_39;
  string local_38 [32];
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if ((sVar3 != 0) &&
     (output_example(in_stack_00000290,in_stack_00000288,in_stack_00000280),
     0 < *(int *)(local_8 + 0x3530))) {
    pcVar2 = *(code **)(local_8 + 0x3540);
    uVar1 = *(undefined4 *)(local_8 + 0x3530);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    (*pcVar2)(uVar1,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void output_example_seq(vw& all, cb_explore_adf& data, multi_ex& ec_seq)
{
  if (ec_seq.size() > 0)
  {
    output_example(all, data, ec_seq);
    if (all.raw_prediction > 0)
      all.print_text(all.raw_prediction, "", ec_seq[0]->tag);
  }
}